

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_4x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar37;
  uint uVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar38;
  uint uVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  int iVar39;
  undefined1 auVar23 [16];
  uint uVar24;
  int iVar25;
  long lVar26;
  undefined1 auVar27 [16];
  long lVar28;
  undefined1 auVar29 [16];
  int iVar40;
  undefined1 auVar31 [16];
  ulong uVar32;
  ulong uVar34;
  undefined1 auVar35 [16];
  ulong uVar36;
  ulong uVar16;
  long lVar30;
  long lVar33;
  
  lVar10 = 0;
  memset(data,0,0x100);
  uVar4 = (ulong)start_col;
  do {
    lVar5 = *(long *)((long)sample_data + lVar10);
    bVar1 = *(byte *)(lVar5 + 3 + uVar4);
    iVar8 = (uint)*(byte *)(lVar5 + uVar4) + (uint)bVar1;
    bVar2 = *(byte *)(lVar5 + 1 + uVar4);
    bVar3 = *(byte *)(lVar5 + 2 + uVar4);
    iVar9 = (uint)bVar2 + (uint)bVar3;
    lVar6 = (ulong)*(byte *)(lVar5 + uVar4) - (ulong)bVar1;
    lVar5 = (ulong)bVar2 - (ulong)bVar3;
    data[lVar10] = (iVar9 + iVar8) * 0x10 + -0x2000;
    data[lVar10 + 2] = (iVar8 - iVar9) * 0x10;
    lVar7 = (lVar5 + lVar6) * 0x1151;
    data[lVar10 + 1] = (DCTELEM)(lVar6 * 0x187e + lVar7 + 0x100U >> 9);
    data[lVar10 + 3] = (DCTELEM)(lVar5 * 0x1ffffffc4df + lVar7 + 0x100U >> 9);
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x20);
  iVar39 = data[0x18] + *data;
  auVar23._4_4_ = data[0x19] + data[1];
  iVar8 = data[0x1a] + data[2];
  iVar9 = data[0x1b] + data[3];
  auVar27._4_4_ = iVar9;
  auVar27._0_4_ = iVar8;
  auVar27._8_4_ = iVar9;
  auVar27._12_4_ = -(uint)(iVar9 < 0);
  auVar23._8_4_ = auVar23._4_4_;
  auVar23._12_4_ = -(uint)(auVar23._4_4_ < 0);
  lVar6 = CONCAT44(-(uint)(iVar39 < 0),iVar39) + 2;
  lVar7 = auVar23._8_8_ + 2;
  lVar26 = CONCAT44(-(uint)(iVar8 < 0),iVar8) + 2;
  lVar28 = auVar27._8_8_ + 2;
  iVar40 = data[0x10] + data[8];
  auVar31._4_4_ = data[0x11] + data[9];
  iVar8 = data[0x12] + data[10];
  iVar9 = data[0x13] + data[0xb];
  auVar35._4_4_ = iVar9;
  auVar35._0_4_ = iVar8;
  auVar31._8_4_ = auVar31._4_4_;
  auVar31._12_4_ = -(uint)(auVar31._4_4_ < 0);
  lVar30 = CONCAT44(-(uint)(iVar40 < 0),iVar40);
  auVar35._8_4_ = iVar9;
  auVar35._12_4_ = -(uint)(iVar9 < 0);
  lVar33 = CONCAT44(-(uint)(iVar8 < 0),iVar8);
  uVar38 = *data - data[0x18];
  auVar17._4_4_ = data[1] - data[0x19];
  uVar19 = data[2] - data[0x1a];
  iVar9 = data[3] - data[0x1b];
  auVar22._4_4_ = iVar9;
  auVar22._0_4_ = uVar19;
  uVar24 = -(uint)((int)uVar19 < 0);
  iVar25 = -(uint)(iVar9 < 0);
  auVar22._8_4_ = iVar9;
  auVar22._12_4_ = iVar25;
  auVar29._0_4_ = -(uint)((int)uVar38 < 0);
  auVar29._4_4_ = -(uint)(auVar17._4_4_ < 0);
  auVar29._12_4_ = -(uint)(iVar9 < 0);
  auVar17._8_4_ = auVar17._4_4_;
  auVar17._12_4_ = auVar29._4_4_;
  lVar5 = CONCAT44(auVar29._0_4_,uVar38);
  uVar37 = data[8] - data[0x10];
  auVar11._4_4_ = data[9] - data[0x11];
  uVar12 = data[10] - data[0x12];
  iVar8 = data[0xb] - data[0x13];
  auVar15._4_4_ = iVar8;
  auVar15._0_4_ = uVar12;
  uVar20 = -(uint)((int)uVar12 < 0);
  iVar21 = -(uint)(iVar8 < 0);
  auVar15._8_4_ = iVar8;
  auVar15._12_4_ = iVar21;
  uVar16 = auVar15._8_8_;
  auVar13._0_4_ = -(uint)((int)uVar37 < 0);
  auVar13._4_4_ = -(uint)(auVar11._4_4_ < 0);
  auVar13._12_4_ = -(uint)(iVar8 < 0);
  auVar11._8_4_ = auVar11._4_4_;
  auVar11._12_4_ = auVar13._4_4_;
  uVar4 = auVar11._8_8_;
  lVar10 = CONCAT44(auVar13._0_4_,uVar37);
  *data = (DCTELEM)((ulong)(lVar6 + lVar30) >> 2);
  data[1] = (DCTELEM)((ulong)(lVar7 + auVar31._8_8_) >> 2);
  data[2] = (DCTELEM)((ulong)(lVar26 + lVar33) >> 2);
  data[3] = (DCTELEM)((ulong)(lVar28 + auVar35._8_8_) >> 2);
  data[0x10] = (DCTELEM)((ulong)(lVar6 - lVar30) >> 2);
  data[0x11] = (DCTELEM)((ulong)(lVar7 - auVar31._8_8_) >> 2);
  data[0x12] = (DCTELEM)((ulong)(lVar26 - lVar33) >> 2);
  data[0x13] = (DCTELEM)((ulong)(lVar28 - auVar35._8_8_) >> 2);
  uVar32 = uVar4 + auVar17._8_8_;
  uVar34 = CONCAT44(uVar20,uVar12) + CONCAT44(uVar24,uVar19);
  uVar36 = uVar16 + auVar22._8_8_;
  lVar6 = (lVar10 + lVar5 & 0xffffffffU) * 0x1151 + 0x4000 +
          (((ulong)(lVar10 + lVar5) >> 0x20) * 0x1151 << 0x20);
  lVar7 = (uVar32 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar32 >> 0x20) * 0x1151 << 0x20);
  lVar10 = (uVar34 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar34 >> 0x20) * 0x1151 << 0x20);
  lVar5 = (uVar36 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar36 >> 0x20) * 0x1151 << 0x20);
  auVar29._8_4_ = auVar29._4_4_;
  auVar18._4_4_ = iVar25;
  auVar18._0_4_ = uVar24;
  auVar18._8_4_ = iVar25;
  auVar18._12_4_ = -(uint)(iVar9 < 0);
  data[8] = (DCTELEM)(((ulong)auVar29._0_4_ * 0x187e << 0x20) + (ulong)uVar38 * 0x187e + lVar6 >>
                     0xf);
  data[9] = (DCTELEM)(((auVar29._8_8_ & 0xffffffff) * 0x187e << 0x20) +
                      (auVar17._8_8_ & 0xffffffff) * 0x187e + lVar7 >> 0xf);
  data[10] = (DCTELEM)(((ulong)uVar24 * 0x187e << 0x20) + (ulong)uVar19 * 0x187e + lVar10 >> 0xf);
  data[0xb] = (DCTELEM)(((auVar18._8_8_ & 0xffffffff) * 0x187e << 0x20) +
                        (auVar22._8_8_ & 0xffffffff) * 0x187e + lVar5 >> 0xf);
  auVar13._8_4_ = auVar13._4_4_;
  auVar14._4_4_ = iVar21;
  auVar14._0_4_ = uVar20;
  auVar14._8_4_ = iVar21;
  auVar14._12_4_ = -(uint)(iVar8 < 0);
  data[0x18] = (DCTELEM)((ulong)uVar37 * 0xffffc4df +
                         ((ulong)uVar37 * 0x7fff + (ulong)auVar13._0_4_ * 0xffffc4df << 0x20) +
                         lVar6 >> 0xf);
  data[0x19] = (DCTELEM)((uVar4 & 0xffffffff) * 0xffffc4df +
                         ((uVar4 & 0xffffffff) * 0x7fff + (auVar13._8_8_ & 0xffffffff) * 0xffffc4df
                         << 0x20) + lVar7 >> 0xf);
  data[0x1a] = (DCTELEM)((ulong)uVar12 * 0xffffc4df +
                         ((ulong)uVar12 * 0x7fff + (ulong)uVar20 * 0xffffc4df << 0x20) + lVar10 >>
                        0xf);
  data[0x1b] = (DCTELEM)((uVar16 & 0xffffffff) * 0xffffc4df +
                         ((uVar16 & 0xffffffff) * 0x7fff + (auVar14._8_8_ & 0xffffffff) * 0xffffc4df
                         << 0x20) + lVar5 >> 0xf);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_4x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;
  INT32 tmp10, tmp11;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by (8/4)**2 = 2**2, which we add here. */
  /* cK represents sqrt(2) * cos(K*pi/16) [refers to 8-point FDCT]. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[3]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[2]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[3]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[2]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp0 + tmp1 - 4 * CENTERJSAMPLE) << (PASS1_BITS+2));
    dataptr[2] = (DCTELEM) ((tmp0 - tmp1) << (PASS1_BITS+2));

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS-PASS1_BITS-3);

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS-PASS1_BITS-2);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS-PASS1_BITS-2);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);       /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS+PASS1_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}